

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O2

void __thiscall
ArtificialPopulation::ArtificialPopulation(ArtificialPopulation *this,ANN *a,Parameters *param)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  int iVar3;
  int local_38;
  int local_34;
  double *local_30;
  Index local_28;
  Index IStack_20;
  
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Population).numberOfInputNeurons = 0;
  (this->super_Population).numberOfOutputNeurons = 0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Population)._vptr_Population = (_func_int **)&PTR_update_00130ca8;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  iVar3 = ANN::getInputSize(a);
  (this->super_Population).numberOfNeurons = iVar3;
  iVar3 = ANN::getInputSize(a);
  (this->super_Population).numberOfInputNeurons = iVar3;
  iVar3 = ANN::getOutputSize(a);
  (this->super_Population).numberOfOutputNeurons = iVar3;
  Population::initialize(&this->super_Population);
  this->ann = a;
  local_38 = 1;
  local_34 = ANN::getInputSize(a);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_30,&local_38,&local_34);
  __ptr = (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = local_30;
  IVar1 = (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  IVar2 = (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = local_28;
  (this->annInput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = IStack_20;
  local_30 = __ptr;
  local_28 = IVar1;
  IStack_20 = IVar2;
  free(__ptr);
  return;
}

Assistant:

ArtificialPopulation::ArtificialPopulation(ANN* a,  Parameters* param) {
    numberOfNeurons = a->getInputSize();
    numberOfInputNeurons = a->getInputSize();
    numberOfOutputNeurons = a->getOutputSize();
    initialize();
    ann = a;
    annInput = Eigen::MatrixXd(1, ann->getInputSize());
}